

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O3

uint32_t __thiscall
basisu::basisu_frontend::refine_block_endpoints_given_selectors(basisu_frontend *this)

{
  uint32_t *puVar1;
  anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1 *paVar2;
  vec2U *pvVar3;
  etc_block *peVar4;
  void *pvVar5;
  byte bVar6;
  uint16_t uVar7;
  int iVar8;
  uint uVar9;
  etc1_optimizer *peVar10;
  anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1 *paVar11;
  long lVar12;
  ulong *puVar13;
  ulong uVar14;
  undefined1 uVar15;
  sbyte sVar16;
  byte bVar17;
  ushort packed_color5;
  float fVar18;
  uint uVar19;
  elemental_vector *peVar20;
  char *pcVar21;
  byte bVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  elemental_vector *peVar26;
  bool bVar27;
  uint uVar28;
  long lVar29;
  ulong *puVar30;
  uint uVar31;
  byte bVar32;
  int iVar33;
  uint uVar34;
  uint uVar35;
  int iVar36;
  uint uVar37;
  ulong uVar38;
  endpoint_cluster_etc_params *peVar39;
  uint uVar40;
  pixel_block *ppVar41;
  elemental_vector *peVar42;
  basisu_frontend *pbVar43;
  float fVar44;
  bool bVar45;
  color_rgba colors [2];
  uint32_t new_size;
  uint32_t b [2];
  uint32_t g [2];
  results cluster_optimizer_results [2];
  uint64_t cur_subblock_err [2];
  uint8_vec subblock_selectors [2];
  vector<basisu::color_rgba> subblock_colors [2];
  vector<unsigned_char> cluster_selectors [2];
  color_rgba unpacked_block_pixels [16];
  char local_322 [2];
  uint local_320;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_31c;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_318;
  uint local_314;
  char *local_310;
  pixel_block *local_308;
  uint local_2fc;
  etc_block *local_2f8;
  basisu_frontend *local_2f0;
  endpoint_cluster_etc_params *local_2e8;
  undefined *local_2e0;
  etc_block *local_2d8;
  uint local_2d0 [2];
  uint32_t local_2c8;
  uint local_2c4;
  long local_2c0;
  void *local_2b8;
  undefined1 local_2b0;
  undefined4 *local_2a8;
  undefined8 local_2a0;
  undefined2 local_298;
  void *local_290;
  ulong local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  ulong uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  ulong local_238 [4];
  elemental_vector local_218;
  elemental_vector local_208;
  elemental_vector local_1f8;
  elemental_vector local_1e8;
  elemental_vector local_1d8;
  elemental_vector local_1c8;
  etc1_optimizer local_1b8;
  
  debug_printf("refine_block_endpoints_given_selectors\n");
  local_2f0 = this;
  if (0 < (int)this->m_total_blocks) {
    fVar44 = 1.4013e-45;
    uVar38 = 0;
    do {
      if ((local_2f0->m_block_endpoint_clusters_indices).m_size <= uVar38) {
        pcVar21 = "T &basisu::vector<basisu::vec2U>::operator[](size_t) [T = basisu::vec2U]";
        goto LAB_00230b8c;
      }
      pvVar3 = (local_2f0->m_block_endpoint_clusters_indices).m_p;
      uVar28 = pvVar3[uVar38].m_comps[0];
      if ((local_2f0->m_endpoint_cluster_etc_params).m_size <= uVar28) {
LAB_00230c62:
        pcVar21 = 
        "T &basisu::vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[](size_t) [T = basisu::basisu_frontend::endpoint_cluster_etc_params]"
        ;
        goto LAB_00230b8c;
      }
      peVar39 = (local_2f0->m_endpoint_cluster_etc_params).m_p;
      local_1b8.m_pParams = (params *)CONCAT44(local_1b8.m_pParams._4_4_,(int)fVar44 + -1);
      peVar10 = (etc1_optimizer *)peVar39[uVar28].m_subblocks.m_p;
      uVar40 = peVar39[uVar28].m_subblocks.m_size;
      uVar14 = (ulong)uVar40;
      if (&local_1b8 < (etc1_optimizer *)((peVar10->m_avg_color).m_v + (uVar14 - 5)) &&
          (peVar10 <= &local_1b8 && peVar10 != (etc1_optimizer *)0x0)) {
LAB_00230c7c:
        pcVar21 = "void basisu::vector<unsigned int>::push_back(const T &) [T = unsigned int]";
LAB_00230c00:
        __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x267,pcVar21);
      }
      fVar18 = (float)((int)fVar44 + -1);
      if (peVar39[uVar28].m_subblocks.m_capacity <= uVar40) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&peVar39[uVar28].m_subblocks,uVar40 + 1,true,4,
                   (object_mover)0x0,false);
        peVar10 = (etc1_optimizer *)peVar39[uVar28].m_subblocks.m_p;
        uVar14 = (ulong)peVar39[uVar28].m_subblocks.m_size;
        fVar18 = local_1b8.m_pParams._0_4_;
      }
      (peVar10->m_avg_color).m_v[uVar14 - 5] = fVar18;
      puVar1 = &peVar39[uVar28].m_subblocks.m_size;
      *puVar1 = *puVar1 + 1;
      uVar28 = pvVar3[uVar38].m_comps[1];
      if ((local_2f0->m_endpoint_cluster_etc_params).m_size <= uVar28) goto LAB_00230c62;
      peVar39 = (local_2f0->m_endpoint_cluster_etc_params).m_p;
      local_1b8.m_pParams = (params *)CONCAT44(local_1b8.m_pParams._4_4_,fVar44);
      peVar10 = (etc1_optimizer *)peVar39[uVar28].m_subblocks.m_p;
      uVar40 = peVar39[uVar28].m_subblocks.m_size;
      uVar14 = (ulong)uVar40;
      if (&local_1b8 < (etc1_optimizer *)((peVar10->m_avg_color).m_v + (uVar14 - 5)) &&
          (peVar10 <= &local_1b8 && peVar10 != (etc1_optimizer *)0x0)) goto LAB_00230c7c;
      fVar18 = fVar44;
      if (peVar39[uVar28].m_subblocks.m_capacity <= uVar40) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&peVar39[uVar28].m_subblocks,uVar40 + 1,true,4,
                   (object_mover)0x0,false);
        peVar10 = (etc1_optimizer *)peVar39[uVar28].m_subblocks.m_p;
        uVar14 = (ulong)peVar39[uVar28].m_subblocks.m_size;
        fVar18 = local_1b8.m_pParams._0_4_;
      }
      (peVar10->m_avg_color).m_v[uVar14 - 5] = fVar18;
      puVar1 = &peVar39[uVar28].m_subblocks.m_size;
      *puVar1 = *puVar1 + 1;
      uVar38 = uVar38 + 1;
      fVar44 = (float)((int)fVar44 + 2);
    } while ((long)uVar38 < (long)(int)local_2f0->m_total_blocks);
  }
  pbVar43 = local_2f0;
  if ((local_2f0->m_endpoint_cluster_etc_params).m_size == 0) {
    fVar44 = 0.0;
    uVar28 = 0;
  }
  else {
    uVar38 = 0;
    uVar28 = 0;
    local_2fc = 0;
    do {
      peVar39 = (pbVar43->m_endpoint_cluster_etc_params).m_p;
      local_238[3] = uVar38;
      local_2e8 = peVar39 + uVar38;
      local_1e8.m_p = (void *)0x0;
      local_1e8.m_size = 0;
      local_1e8.m_capacity = 0;
      local_1f8.m_p = (void *)0x0;
      local_1f8.m_size = 0;
      local_1f8.m_capacity = 0;
      local_208.m_p = (void *)0x0;
      local_208.m_size = 0;
      local_208.m_capacity = 0;
      local_218.m_p = (void *)0x0;
      local_218.m_size = 0;
      local_218.m_capacity = 0;
      local_238[0] = 0;
      local_238[1] = 0;
      local_320 = uVar28;
      if (peVar39[uVar38].m_subblocks.m_size != 0) {
        uVar38 = 0;
        do {
          uVar28 = (local_2e8->m_subblocks).m_p[uVar38];
          uVar40 = uVar28 >> 1;
          if ((pbVar43->m_encoded_blocks).m_size <= uVar40) goto LAB_00230b77;
          if ((pbVar43->m_source_blocks).m_size <= uVar40) {
            __assert_fail("i < m_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                          ,0x177,
                          "const T &basisu::vector<basisu::pixel_block>::operator[](size_t) const [T = basisu::pixel_block]"
                         );
          }
          local_2f8 = (pbVar43->m_encoded_blocks).m_p + uVar40;
          bVar6 = (local_2f8->field_0).m_bytes[3];
          ppVar41 = (pbVar43->m_source_blocks).m_p + uVar40;
          unpack_etc1(local_2f8,(color_rgba *)&local_1b8,false);
          uVar28 = uVar28 & 1;
          bVar45 = (bVar6 & 2) == 0;
          local_2d8 = (etc_block *)(ulong)bVar45;
          peVar42 = &local_1f8 + bVar45;
          peVar20 = &local_218 + bVar45;
          local_310 = g_etc1_pixel_indices + (ulong)(uVar28 << 5) + 0x40;
          local_2e0 = &DAT_0031bf51 + (uVar28 << 4);
          lVar29 = 0;
          local_314 = (uint)uVar38;
          local_308 = ppVar41;
          do {
            uVar38 = (ulong)*(uint *)(local_310 + lVar29 * 4);
            paVar2 = (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1 *)
                     (ppVar41->m_pixels[0] + uVar38);
            paVar11 = (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1 *)
                      peVar42->m_p;
            uVar28 = (&local_1f8)[bVar45].m_size;
            uVar14 = (ulong)uVar28;
            if (((paVar11 !=
                  (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1 *)0x0) &&
                (paVar11 <= paVar2)) && (paVar2 < paVar11 + uVar14)) {
              pcVar21 = 
              "void basisu::vector<basisu::color_rgba>::push_back(const T &) [T = basisu::color_rgba]"
              ;
              goto LAB_00230c00;
            }
            if ((&local_1f8)[bVar45].m_capacity <= uVar28) {
              elemental_vector::increase_capacity(peVar42,uVar28 + 1,true,4,(object_mover)0x0,false)
              ;
              paVar11 = (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1 *)
                        peVar42->m_p;
              uVar14 = (ulong)(&local_1f8)[bVar45].m_size;
            }
            ppVar41 = local_308;
            ((anon_union_4_2_6eba8969_for_color_rgba_0 *)(paVar11 + uVar14))->field_1 = *paVar2;
            (&local_1f8)[bVar45].m_size = (&local_1f8)[bVar45].m_size + 1;
            if ((pbVar43->m_params).m_perceptual == true) {
              iVar8 = (uint)paVar2->r - (uint)*(byte *)(local_1b8.m_avg_color.m_v + (uVar38 - 5));
              iVar23 = (uint)paVar2->b -
                       (uint)*(byte *)((long)local_1b8.m_avg_color.m_v + uVar38 * 4 + -0x12);
              iVar33 = iVar23 * 9 + iVar8 * 0x1b +
                       ((uint)paVar2->g -
                       (uint)*(byte *)((long)local_1b8.m_avg_color.m_v + uVar38 * 4 + -0x13)) * 0x5c
              ;
              lVar12 = (long)(iVar8 * 0x80 - iVar33);
              lVar25 = (long)(iVar23 * 0x80 - iVar33);
              uVar28 = ((uint)((int)((ulong)(lVar25 * lVar25) >> 7) * 3) >> 7) +
                       (int)((ulong)((long)iVar33 * (long)iVar33) >> 7) +
                       ((uint)((int)((ulong)(lVar12 * lVar12) >> 7) * 0x1a) >> 7);
            }
            else {
              iVar23 = (uint)paVar2->g -
                       (uint)*(byte *)((long)local_1b8.m_avg_color.m_v + uVar38 * 4 + -0x13);
              iVar33 = (uint)paVar2->b -
                       (uint)*(byte *)((long)local_1b8.m_avg_color.m_v + uVar38 * 4 + -0x12);
              iVar8 = (uint)paVar2->r - (uint)*(byte *)(local_1b8.m_avg_color.m_v + (uVar38 - 5));
              uVar28 = iVar33 * iVar33 + iVar23 * iVar23 + iVar8 * iVar8;
            }
            local_238[(long)local_2d8] = local_238[(long)local_2d8] + (ulong)uVar28;
            bVar6 = local_2e0[lVar29 * 2 + -1];
            if (3 < (local_2e0[lVar29 * 2] | bVar6)) {
              __assert_fail("(x | y) < 4",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.h"
                            ,0xe3,
                            "uint32_t basisu::etc_block::get_raw_selector(uint32_t, uint32_t) const"
                           );
            }
            uVar28 = (uint)(byte)local_2e0[lVar29 * 2] + (bVar6 & 1) * 4;
            uVar15 = *(undefined1 *)
                      ((long)&g_etc1_to_selector_index +
                      (ulong)((uint)((*(byte *)((long)local_2f8 + (7 - (ulong)(bVar6 >> 1))) >>
                                      (uVar28 & 0x1f) & 1) != 0) +
                             (*(byte *)((long)local_2f8 + (5 - (ulong)(bVar6 >> 1))) >>
                              ((byte)uVar28 & 0x1f) & 1) * 2));
            local_288 = CONCAT71(local_288._1_7_,uVar15);
            puVar13 = (ulong *)peVar20->m_p;
            uVar28 = (&local_218)[bVar45].m_size;
            uVar38 = (ulong)uVar28;
            if (&local_288 < (ulong *)((long)puVar13 + uVar38) &&
                (puVar13 <= &local_288 && puVar13 != (ulong *)0x0)) {
              pcVar21 = 
              "void basisu::vector<unsigned char>::push_back(const T &) [T = unsigned char]";
              goto LAB_00230c00;
            }
            if ((&local_218)[bVar45].m_capacity <= uVar28) {
              elemental_vector::increase_capacity(peVar20,uVar28 + 1,true,1,(object_mover)0x0,false)
              ;
              puVar13 = (ulong *)peVar20->m_p;
              uVar38 = (ulong)(&local_218)[bVar45].m_size;
              uVar15 = (undefined1)local_288;
            }
            *(undefined1 *)((long)puVar13 + uVar38) = uVar15;
            (&local_218)[bVar45].m_size = (&local_218)[bVar45].m_size + 1;
            lVar29 = lVar29 + 1;
          } while (lVar29 != 8);
          uVar38 = (ulong)(local_314 + 1);
        } while (local_314 + 1 < (local_2e8->m_subblocks).m_size);
      }
      uVar15 = 0;
      local_322[0] = '\0';
      local_322[1] = 0;
      local_288 = 0;
      uStack_280 = 0;
      local_278 = 0;
      uStack_270 = 0;
      local_268 = 0;
      uStack_260 = 0;
      local_258 = 0;
      uStack_250 = 0;
      local_248 = 0;
      uStack_240 = 0;
      local_1c8.m_p = (void *)0x0;
      local_1c8.m_size = 0;
      local_1c8.m_capacity = 0;
      local_1d8.m_p = (void *)0x0;
      local_1d8.m_size = 0;
      local_1d8.m_capacity = 0;
      peVar42 = &local_1d8;
      local_310 = local_322;
      puVar13 = &local_288;
      puVar30 = local_238;
      peVar20 = &local_218;
      peVar26 = &local_1f8;
      bVar45 = true;
      do {
        bVar27 = bVar45;
        uVar28 = peVar26->m_size;
        if (uVar28 != 0) {
          local_1b8.m_best_solution.m_selectors.m_p = (uchar *)0x0;
          local_1b8.m_best_solution.m_selectors.m_size = 0;
          local_1b8.m_best_solution.m_selectors.m_capacity = 0;
          local_1b8.m_sorted_luma_indices.m_p = (uint *)0x0;
          local_1b8.m_sorted_luma_indices.m_size = 0;
          local_1b8.m_sorted_luma_indices.m_capacity = 0;
          local_1b8.m_sorted_luma.m_p = (uint *)0x0;
          local_1b8.m_sorted_luma.m_size = 0;
          local_1b8.m_sorted_luma.m_capacity = 0;
          local_1b8.m_luma.m_p = (unsigned_short *)0x0;
          local_1b8.m_luma.m_size = 0;
          local_1b8.m_luma.m_capacity = 0;
          local_1b8.m_best_solution.m_coords.m_unscaled_color.field_0.m_comps[0] = '\0';
          local_1b8.m_best_solution.m_coords._1_8_ = 0;
          local_1b8.m_best_selectors.m_p = (uchar *)0x0;
          local_1b8.m_best_selectors.m_size._0_1_ = 0;
          local_1b8.m_best_selectors._9_7_ = 0;
          local_1b8.m_selectors.m_p = (uchar *)0x0;
          local_1b8.m_selectors.m_size = 0;
          local_1b8.m_selectors.m_capacity = 0;
          local_1b8.m_best_solution.m_error = 0xffffffffffffffff;
          local_1b8.m_best_solution.m_valid = false;
          local_1b8.m_trial_solution.m_coords.m_color4 = false;
          local_1b8.m_trial_solution.m_coords.m_unscaled_color.field_0 =
               (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
          local_1b8.m_trial_solution.m_coords.m_inten_table = 0;
          local_1b8.m_trial_solution.m_selectors.m_p = (uchar *)0x0;
          local_1b8.m_trial_solution.m_selectors.m_size = 0;
          local_1b8.m_trial_solution.m_selectors.m_capacity = 0;
          local_1b8.m_trial_solution.m_error = 0xffffffffffffffff;
          local_1b8.m_trial_solution.m_valid = false;
          local_1b8.m_temp_selectors.m_p = (uchar *)0x0;
          local_1b8.m_temp_selectors.m_size = 0;
          local_1b8.m_temp_selectors.m_capacity = 0;
          local_1b8.m_pParams = (params *)0x0;
          local_1b8.m_pResult = (results *)0x0;
          local_1b8.m_pSorted_luma_indices = (uint32_t *)0x0;
          local_1b8.m_pSorted_luma = (uint32_t *)0x0;
          local_2c8 = 2;
          local_2a8 = &etc1_optimizer::params::clear_optimizer_params()::s_default_scan_delta;
          local_2a0 = 1;
          local_298 = 0x100;
          local_290 = (void *)0x0;
          local_2c0 = (ulong)uVar28 << 0x20;
          local_2b8 = peVar26->m_p;
          local_2c4 = CONCAT31(0x10001,(pbVar43->m_params).m_perceptual);
          local_2b0 = uVar15;
          if (peVar20->m_size == 0) {
            pcVar21 = "T &basisu::vector<unsigned char>::operator[](size_t) [T = unsigned char]";
            goto LAB_00230b8c;
          }
          local_290 = peVar20->m_p;
          local_2c8 = 3;
          uVar40 = peVar42->m_size;
          if (uVar40 != uVar28) {
            if (uVar40 <= uVar28) {
              if (peVar42->m_capacity < uVar28) {
                elemental_vector::increase_capacity
                          (peVar42,uVar28,uVar40 + 1 == uVar28,1,(object_mover)0x0,false);
                uVar40 = peVar42->m_size;
              }
              memset((void *)((ulong)uVar40 + (long)peVar42->m_p),0,(ulong)(uVar28 - uVar40));
            }
            peVar42->m_size = uVar28;
          }
          *(uint *)(puVar13 + 2) = uVar28;
          puVar13[3] = (ulong)peVar42->m_p;
          etc1_optimizer::init(&local_1b8,(EVP_PKEY_CTX *)&local_2c8);
          bVar45 = etc1_optimizer::compute(&local_1b8);
          if ((bVar45) && (*puVar13 < *puVar30)) {
            *local_310 = '\x01';
          }
          local_2fc = local_2fc + (uVar28 >> 3);
          etc1_optimizer::~etc1_optimizer(&local_1b8);
        }
        uVar15 = 1;
        peVar42 = &local_1c8;
        local_310 = local_322 + 1;
        puVar13 = &uStack_260;
        puVar30 = local_238 + 1;
        peVar20 = &local_208;
        peVar26 = &local_1e8;
        bVar45 = false;
      } while (bVar27);
      uVar38 = CONCAT71((int7)((ulong)local_310 >> 8),1);
      pcVar21 = local_322;
      local_310 = (char *)0x0;
      peVar39 = local_2e8;
      uVar28 = local_320;
      do {
        if (*pcVar21 == '\x01') {
          uVar14 = CONCAT71((int7)((ulong)pcVar21 >> 8),1);
          local_2e0 = (undefined *)((ulong)local_2e0 & 0xffffffff00000000);
          peVar20 = (elemental_vector *)CONCAT71((int7)((ulong)peVar20 >> 8),1);
          local_308 = (pixel_block *)CONCAT44(local_308._4_4_,(int)uVar38);
          do {
            if ((peVar39->m_subblocks).m_size != 0) {
              local_314 = (uint)peVar20;
              local_2f8 = (etc_block *)CONCAT44(local_2f8._4_4_,(int)uVar14);
              uVar38 = 0;
              do {
                uVar40 = (peVar39->m_subblocks).m_p[uVar38];
                uVar9 = uVar40 >> 1;
                if ((pbVar43->m_encoded_blocks).m_size <= uVar9) goto LAB_00230b77;
                peVar4 = (pbVar43->m_encoded_blocks).m_p;
                if (local_310 == (char *)(ulong)((peVar4[uVar9].field_0.m_bytes[3] & 2) == 0)) {
                  uVar40 = uVar40 & 1;
                  peVar4 = peVar4 + uVar9;
                  if (((ulong)local_308 & 1) != 0) {
                    bVar6 = (peVar4->field_0).m_bytes[0];
                    bVar17 = (peVar4->field_0).m_bytes[1];
                    bVar22 = (peVar4->field_0).m_bytes[2];
                    packed_color5 =
                         (bVar6 & 0xf8) << 7 | (ushort)(bVar22 >> 3) + (bVar17 & 0xfff8) * 4;
                    local_320 = uVar28;
                    local_2d8 = peVar4;
                    etc_block::unpack_color5
                              ((uint32_t *)&local_1b8,&local_2c8,local_2d0,packed_color5,false);
                    bVar45 = etc_block::unpack_color5
                                       ((uint32_t *)((long)&local_1b8.m_pParams + 4),&local_2c4,
                                        local_2d0 + 1,packed_color5,
                                        (bVar22 & 7) + (bVar17 & 7) * 8 | (bVar6 & 7) << 6,false,
                                        0xff);
                    peVar39 = local_2e8;
                    pbVar43 = local_2f0;
                    uVar28 = local_320;
                    if (!bVar45) {
                      __assert_fail("success",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp"
                                    ,0xb72,
                                    "uint32_t basisu::basisu_frontend::refine_block_endpoints_given_selectors()"
                                   );
                    }
                    uVar14 = (ulong)(uVar40 << 2);
                    *(uint *)((long)local_1b8.m_avg_color.m_v + (uVar14 - 0x14)) =
                         (uint)(byte)uStack_280;
                    *(uint *)((long)&local_2c8 + uVar14) = (uint)uStack_280._1_1_;
                    *(uint *)((long)local_2d0 + uVar14) = (uint)uStack_280._2_1_;
                    uVar9 = 0xff;
                    if ((uint)local_1b8.m_pParams._0_4_ < 0xff) {
                      uVar9 = (uint)local_1b8.m_pParams._0_4_;
                    }
                    if ((int)local_1b8.m_pParams._0_4_ < 0) {
                      uVar9 = 0;
                    }
                    local_31c.m_comps[0] = (uint8_t)uVar9;
                    uVar19 = 0xff;
                    if (local_2c8 < 0xff) {
                      uVar19 = local_2c8;
                    }
                    if ((int)local_2c8 < 0) {
                      uVar19 = 0;
                    }
                    local_31c.m_comps[1] = (uint8_t)uVar19;
                    uVar31 = 0xff;
                    if (local_2d0[0] < 0xff) {
                      uVar31 = local_2d0[0];
                    }
                    uVar37 = 0;
                    if ((int)local_2d0[0] < 0) {
                      uVar31 = 0;
                    }
                    uVar24 = 0xff;
                    if (local_1b8.m_pParams._4_4_ < 0xff) {
                      uVar24 = local_1b8.m_pParams._4_4_;
                    }
                    local_31c.m_comps[2] = (uint8_t)uVar31;
                    if ((long)local_1b8.m_pParams < 0) {
                      uVar24 = uVar37;
                    }
                    uVar34 = 0xff;
                    if (local_2c4 < 0xff) {
                      uVar34 = local_2c4;
                    }
                    local_31c.m_comps[3] = 0xff;
                    if ((int)local_2c4 < 0) {
                      uVar34 = uVar37;
                    }
                    uVar35 = 0xff;
                    if (local_2d0[1] < 0xff) {
                      uVar35 = local_2d0[1];
                    }
                    local_318.m_comps[0] = (uint8_t)uVar24;
                    if ((int)local_2d0[1] < 0) {
                      uVar35 = uVar37;
                    }
                    local_318.m_comps[1] = (uint8_t)uVar34;
                    local_318.m_comps[2] = (uint8_t)uVar35;
                    local_318.m_comps[3] = 0xff;
                    iVar33 = (uVar24 & 0xff) - (uVar9 & 0xff);
                    iVar23 = (uVar34 & 0xff) - (uVar19 & 0xff);
                    iVar36 = (uVar35 & 0xff) - (uVar31 & 0xff);
                    iVar8 = iVar23;
                    if (iVar33 < iVar23) {
                      iVar8 = iVar33;
                    }
                    if (iVar36 <= iVar8) {
                      iVar8 = iVar36;
                    }
                    if (-5 < iVar8) {
                      if (iVar23 < iVar33) {
                        iVar23 = iVar33;
                      }
                      if (iVar23 <= iVar36) {
                        iVar23 = iVar36;
                      }
                      if (iVar23 < 4) {
                        if (((ulong)local_2e0 & 1) == 0) goto LAB_00230a40;
                        etc_block::set_block_color5
                                  (local_2d8,(color_rgba *)&local_31c.field_1,
                                   (color_rgba *)&local_318.field_1);
                        if (7 < uStack_280._4_4_) goto LAB_00230b96;
                        sVar16 = (uVar40 == 0) * '\x03' + 2;
                        (local_2d8->field_0).m_bytes[3] =
                             (byte)(uStack_280._4_4_ << sVar16) |
                             ~(byte)(7 << sVar16) & (local_2d8->field_0).m_bytes[3];
                        peVar39->m_color_error[0] = local_288;
                        peVar39->m_inten_table[0] = uStack_280._4_4_;
                        peVar39->m_color_unscaled[0].field_0 = uStack_280._0_4_;
                        goto LAB_00230a3d;
                      }
                    }
                    peVar20 = (elemental_vector *)0x0;
                    uVar38 = (ulong)local_308 & 0xffffffff;
                    uVar14 = (ulong)local_2f8 & 0xffffffff;
                    goto LAB_00230a78;
                  }
                  uVar7 = etc_block::pack_color4((color_rgba *)&local_258,false,0x7f);
                  bVar6 = (byte)uVar7;
                  if (uVar40 == 0) {
                    bVar17 = (byte)(uVar7 >> 4) & 0xf0 | (peVar4->field_0).m_bytes[0] & 0xf;
                    bVar32 = bVar6 & 0xf0 | (peVar4->field_0).m_bytes[1] & 0xf;
                    bVar22 = (peVar4->field_0).m_bytes[2] & 0xf;
                    bVar6 = bVar6 << 4;
                  }
                  else {
                    bVar17 = (byte)(uVar7 >> 8) & 0xf | (peVar4->field_0).m_bytes[0] & 0xf0;
                    bVar32 = (byte)(uVar7 >> 4) & 0xf | (peVar4->field_0).m_bytes[1] & 0xf0;
                    bVar22 = (peVar4->field_0).m_bytes[2] & 0xf0;
                    bVar6 = bVar6 & 0xf;
                  }
                  (peVar4->field_0).m_bytes[0] = bVar17;
                  (peVar4->field_0).m_bytes[1] = bVar32;
                  (peVar4->field_0).m_bytes[2] = bVar6 | bVar22;
                  if (7 < local_258._4_4_) {
LAB_00230b96:
                    __assert_fail("t < 8",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.h"
                                  ,0xc1,
                                  "void basisu::etc_block::set_inten_table(uint32_t, uint32_t)");
                  }
                  sVar16 = (uVar40 == 0) * '\x03' + 2;
                  (peVar4->field_0).m_bytes[3] =
                       (byte)(local_258._4_4_ << sVar16) |
                       ~(byte)(7 << sVar16) & (peVar4->field_0).m_bytes[3];
                  peVar39->m_color_error[1] = uStack_260;
                  peVar39->m_inten_table[1] = local_258._4_4_;
                  peVar39->m_color_unscaled[1].field_0 = local_258._0_4_;
LAB_00230a3d:
                  uVar28 = uVar28 + 1;
                }
LAB_00230a40:
                uVar38 = uVar38 + 1;
              } while (uVar38 < (peVar39->m_subblocks).m_size);
              uVar14 = (ulong)local_2f8 & 0xffffffff;
              peVar20 = (elemental_vector *)(ulong)local_314;
              uVar38 = (ulong)local_308 & 0xffffffff;
            }
LAB_00230a78:
            bVar6 = (byte)uVar14;
            local_2e0 = (undefined *)CONCAT44(local_2e0._4_4_,(int)peVar20);
            uVar14 = 0;
          } while ((bVar6 & (byte)uVar38 & 1) != 0);
        }
        local_310 = (char *)0x1;
        pcVar21 = local_322 + 1;
        uVar14 = uVar38 & 1;
        uVar38 = 0;
      } while (uVar14 != 0);
      lVar29 = 0x20;
      do {
        pvVar5 = *(void **)((long)&local_1e8.m_p + lVar29);
        if (pvVar5 != (void *)0x0) {
          free(pvVar5);
        }
        lVar29 = lVar29 + -0x10;
      } while (lVar29 != 0);
      lVar29 = 0x20;
      do {
        pvVar5 = *(void **)((long)local_238 + lVar29 + 0x10);
        if (pvVar5 != (void *)0x0) {
          free(pvVar5);
        }
        lVar29 = lVar29 + -0x10;
      } while (lVar29 != 0);
      lVar29 = 0x20;
      do {
        pvVar5 = *(void **)((long)&local_208.m_p + lVar29);
        if (pvVar5 != (void *)0x0) {
          free(pvVar5);
        }
        lVar29 = lVar29 + -0x10;
      } while (lVar29 != 0);
      uVar38 = local_238[3] + 1;
    } while (uVar38 < (pbVar43->m_endpoint_cluster_etc_params).m_size);
    fVar44 = (float)local_2fc;
  }
  if ((pbVar43->m_params).m_debug_stats != false) {
    debug_printf("Total subblock endpoints refined: %u (%3.1f%%)\n",
                 SUB84((double)(((float)uVar28 * 100.0) / fVar44),0),(ulong)uVar28);
  }
  return uVar28;
LAB_00230b77:
  pcVar21 = "T &basisu::vector<basisu::etc_block>::operator[](size_t) [T = basisu::etc_block]";
LAB_00230b8c:
  __assert_fail("i < m_size",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x178,pcVar21);
}

Assistant:

uint32_t basisu_frontend::refine_block_endpoints_given_selectors()
	{
		debug_printf("refine_block_endpoints_given_selectors\n");
				
		for (int block_index = 0; block_index < static_cast<int>(m_total_blocks); block_index++)
		{
			//uint32_t selector_cluster = m_block_selector_cluster_index(block_x, block_y);
			vec2U &endpoint_clusters = m_block_endpoint_clusters_indices[block_index];

			m_endpoint_cluster_etc_params[endpoint_clusters[0]].m_subblocks.push_back(block_index * 2);

			m_endpoint_cluster_etc_params[endpoint_clusters[1]].m_subblocks.push_back(block_index * 2 + 1);
		}

		uint32_t total_subblocks_refined = 0;
		uint32_t total_subblocks_examined = 0;

		for (uint32_t endpoint_cluster_index = 0; endpoint_cluster_index < m_endpoint_cluster_etc_params.size(); endpoint_cluster_index++)
		{
			endpoint_cluster_etc_params &subblock_params = m_endpoint_cluster_etc_params[endpoint_cluster_index];

			const uint_vec &subblocks = subblock_params.m_subblocks;
			//uint32_t total_pixels = subblock.m_subblocks.size() * 8;

			basisu::vector<color_rgba> subblock_colors[2]; // [use_individual_mode]
			uint8_vec subblock_selectors[2];

			uint64_t cur_subblock_err[2] = { 0, 0 };

			for (uint32_t subblock_iter = 0; subblock_iter < subblocks.size(); subblock_iter++)
			{
				uint32_t training_vector_index = subblocks[subblock_iter];

				uint32_t block_index = training_vector_index >> 1;
				uint32_t subblock_index = training_vector_index & 1;
				const bool is_flipped = true;

				const etc_block &blk = m_encoded_blocks[block_index];

				const bool use_individual_mode = !blk.get_diff_bit();

				const color_rgba *pSource_block_pixels = get_source_pixel_block(block_index).get_ptr();

				color_rgba unpacked_block_pixels[16];
				unpack_etc1(blk, unpacked_block_pixels);

				for (uint32_t i = 0; i < 8; i++)
				{
					const uint32_t pixel_index = g_etc1_pixel_indices[is_flipped][subblock_index][i];
					const etc_coord2 &coords = g_etc1_pixel_coords[is_flipped][subblock_index][i];

					subblock_colors[use_individual_mode].push_back(pSource_block_pixels[pixel_index]);

					cur_subblock_err[use_individual_mode] += color_distance(m_params.m_perceptual, pSource_block_pixels[pixel_index], unpacked_block_pixels[pixel_index], false);

					subblock_selectors[use_individual_mode].push_back(static_cast<uint8_t>(blk.get_selector(coords.m_x, coords.m_y)));
				}
			} // subblock_iter

			etc1_optimizer::results cluster_optimizer_results[2];
			bool results_valid[2] = { false, false };

			clear_obj(cluster_optimizer_results);

			basisu::vector<uint8_t> cluster_selectors[2];

			for (uint32_t use_individual_mode = 0; use_individual_mode < 2; use_individual_mode++)
			{
				const uint32_t total_pixels = (uint32_t)subblock_colors[use_individual_mode].size();

				if (!total_pixels)
					continue;

				total_subblocks_examined += total_pixels / 8;

				etc1_optimizer optimizer;
				etc1_solution_coordinates solutions[2];

				etc1_optimizer::params cluster_optimizer_params;
				cluster_optimizer_params.m_num_src_pixels = total_pixels;
				cluster_optimizer_params.m_pSrc_pixels = &subblock_colors[use_individual_mode][0];

				cluster_optimizer_params.m_use_color4 = use_individual_mode != 0;
				cluster_optimizer_params.m_perceptual = m_params.m_perceptual;

				cluster_optimizer_params.m_pForce_selectors = &subblock_selectors[use_individual_mode][0];
				cluster_optimizer_params.m_quality = cETCQualityUber;

				cluster_selectors[use_individual_mode].resize(total_pixels);

				cluster_optimizer_results[use_individual_mode].m_n = total_pixels;
				cluster_optimizer_results[use_individual_mode].m_pSelectors = &cluster_selectors[use_individual_mode][0];

				optimizer.init(cluster_optimizer_params, cluster_optimizer_results[use_individual_mode]);

				if (!optimizer.compute())
					continue;

				if (cluster_optimizer_results[use_individual_mode].m_error < cur_subblock_err[use_individual_mode])
					results_valid[use_individual_mode] = true;

			} // use_individual_mode

			for (uint32_t use_individual_mode = 0; use_individual_mode < 2; use_individual_mode++)
			{
				if (!results_valid[use_individual_mode])
					continue;

				uint32_t num_passes = use_individual_mode ? 1 : 2;

				bool all_passed5 = true;

				for (uint32_t pass = 0; pass < num_passes; pass++)
				{
					for (uint32_t subblock_iter = 0; subblock_iter < subblocks.size(); subblock_iter++)
					{
						const uint32_t training_vector_index = subblocks[subblock_iter];

						const uint32_t block_index = training_vector_index >> 1;
						const uint32_t subblock_index = training_vector_index & 1;
						//const bool is_flipped = true;

						etc_block &blk = m_encoded_blocks[block_index];

						if (!blk.get_diff_bit() != static_cast<bool>(use_individual_mode != 0))
							continue;

						if (use_individual_mode)
						{
							blk.set_base4_color(subblock_index, etc_block::pack_color4(cluster_optimizer_results[1].m_block_color_unscaled, false));
							blk.set_inten_table(subblock_index, cluster_optimizer_results[1].m_block_inten_table);

							subblock_params.m_color_error[1] = cluster_optimizer_results[1].m_error;
							subblock_params.m_inten_table[1] = cluster_optimizer_results[1].m_block_inten_table;
							subblock_params.m_color_unscaled[1] = cluster_optimizer_results[1].m_block_color_unscaled;

							total_subblocks_refined++;
						}
						else
						{
							const uint16_t base_color5 = blk.get_base5_color();
							const uint16_t delta_color3 = blk.get_delta3_color();

							uint32_t r[2], g[2], b[2];
							etc_block::unpack_color5(r[0], g[0], b[0], base_color5, false);
							bool success = etc_block::unpack_color5(r[1], g[1], b[1], base_color5, delta_color3, false);
							assert(success);
							BASISU_NOTE_UNUSED(success);

							r[subblock_index] = cluster_optimizer_results[0].m_block_color_unscaled.r;
							g[subblock_index] = cluster_optimizer_results[0].m_block_color_unscaled.g;
							b[subblock_index] = cluster_optimizer_results[0].m_block_color_unscaled.b;

							color_rgba colors[2] = { color_rgba(r[0], g[0], b[0], 255), color_rgba(r[1], g[1], b[1], 255) };

							if (!etc_block::try_pack_color5_delta3(colors))
							{
								all_passed5 = false;
								break;
							}

							if ((pass == 1) && (all_passed5))
							{
								blk.set_block_color5(colors[0], colors[1]);
								blk.set_inten_table(subblock_index, cluster_optimizer_results[0].m_block_inten_table);

								subblock_params.m_color_error[0] = cluster_optimizer_results[0].m_error;
								subblock_params.m_inten_table[0] = cluster_optimizer_results[0].m_block_inten_table;
								subblock_params.m_color_unscaled[0] = cluster_optimizer_results[0].m_block_color_unscaled;

								total_subblocks_refined++;
							}
						}

					} // subblock_iter

				} // pass

			} // use_individual_mode

		} // endpoint_cluster_index

		if (m_params.m_debug_stats)
			debug_printf("Total subblock endpoints refined: %u (%3.1f%%)\n", total_subblocks_refined, total_subblocks_refined * 100.0f / total_subblocks_examined);
				
		return total_subblocks_refined;
	}